

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O3

void __thiscall SPTest_RandomRHS_Test::TestBody(SPTest_RandomRHS_Test *this)

{
  FunctionMocker<void_(int,_double)> *this_00;
  int iVar1;
  pointer piVar2;
  bool bVar3;
  MockSpec<void_(int,_double)> *this_01;
  char *message;
  ColumnSizeHandler cols;
  MockScenarioHandler handler;
  TestProblem p;
  SPAdapter sp;
  NLHeader header;
  Matcher<int> local_870;
  Matcher<double> local_858;
  ColumnSizeHandler local_840;
  MockScenarioHandler local_838;
  TestProblem local_720;
  SPAdapter local_370;
  NLHeader local_128;
  
  memset(&local_128,0,0xa8);
  local_128.super_NLInfo.super_NLInfo_C.format = 1;
  local_128.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_128.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_128.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_128.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_128.super_NLInfo.super_NLInfo_C.flags = 1;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_128.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  local_128.super_NLProblemInfo.super_NLProblemInfo_C.num_vars = 2;
  local_128.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&local_720,&local_128);
  TestProblem::MakeTestRV(&local_720);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_720,0.0,0.0);
  local_840.problem_ = local_720.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&local_840,1);
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&local_840,0);
  gch::detail::small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>::request_capacity
            ((small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U> *)
             ((local_720.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->super_Problem).
             algebraic_cons_.
             super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  piVar2 = ((local_720.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->col_starts_).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  ((local_720.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->row_indices_).
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar1] = 0;
  ((local_720.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_)->coefs_).
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  [iVar1] = 3.0;
  mp::SPAdapter::SPAdapter(&local_370,&local_720.super_ColProblem);
  piVar2 = ((local_370.problem_)->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_870.super_MatcherBase<int>.impl_.value_._0_4_ =
       piVar2[*local_370.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start];
  local_858.super_MatcherBase<double>.impl_.value_._0_4_ =
       piVar2[(long)*local_370.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1];
  local_870.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&local_370;
  local_858.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&local_370;
  testing::internal::CmpHelperEQ<mp::SPAdapter::Column::Iterator,mp::SPAdapter::Column::Iterator>
            ((internal *)&local_838,"col.begin()","col.end()",(Iterator *)&local_870,
             (Iterator *)&local_858);
  if ((char)local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
            super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase == '\0') {
    testing::Message::Message((Message *)&local_870);
    if ((undefined8 *)
        local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
        super_UntypedFunctionMockerBase.mock_obj_ == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
                 super_UntypedFunctionMockerBase.mock_obj_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_858,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x237,
               message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_858,(Message *)&local_870);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_858);
    if ((SPAdapter *)local_870.super_MatcherBase<int>._vptr_MatcherBase != (SPAdapter *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((SPAdapter *)local_870.super_MatcherBase<int>._vptr_MatcherBase != (SPAdapter *)0x0)) {
        (*(code *)((*(ColProblem **)local_870.super_MatcherBase<int>._vptr_MatcherBase)->
                  super_Problem).super_ExprFactory.exprs_.
                  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
            super_UntypedFunctionMockerBase.mock_obj_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_838);
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
               current_spec_.matchers_.
               super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
       + 0x10);
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<2UL,_testing::Matcher<double>_>.
  super__Head_base<2UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199238;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_838.gmock3_OnTerm_551.
                        super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                + 0x28);
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_838.gmock3_OnTerm_551.
                        super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>
                + 0x40);
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_00199168;
  this_00 = &local_838.gmock2_OnRHS_552;
  local_838.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.current_spec_.
  function_mocker_ = (FunctionMockerBase<void_(int,_int,_double)> *)&local_838;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.link_.next_ =
       (linked_ptr_internal *)
       ((long)&local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_
               .matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
       0x10);
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  impl_.value_ = (MatcherInterface<double> *)0x0;
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Tuple_impl<1UL,_testing::Matcher<double>_>.
  super__Head_base<1UL,_testing::Matcher<double>,_false>._M_head_impl.super_MatcherBase<double>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199238;
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  value_ = (MatcherInterface<int> *)0x0;
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.impl_.
  link_.next_ = (linked_ptr_internal *)
                ((long)&local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.
                        current_spec_.matchers_.
                        super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_> +
                0x28);
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.matchers_.
  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>_>.
  super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992a0;
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001993b8;
  local_838.gmock2_OnRHS_552.super_FunctionMockerBase<void_(int,_double)>.current_spec_.
  function_mocker_ = &this_00->super_FunctionMockerBase<void_(int,_double)>;
  testing::Matcher<int>::Matcher(&local_870,0);
  testing::Matcher<double>::Matcher(&local_858,-33.0);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,&local_838);
  this_01 = testing::internal::FunctionMocker<void_(int,_double)>::With
                      (this_00,&local_870,&local_858);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (this_01,"/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",
             0x239,"handler","OnRHS(0, -33)");
  local_858.super_MatcherBase<double>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00199280;
  testing::internal::linked_ptr<const_testing::MatcherInterface<double>_>::~linked_ptr
            (&local_858.super_MatcherBase<double>.impl_);
  local_870.super_MatcherBase<int>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001992e8;
  testing::internal::linked_ptr<const_testing::MatcherInterface<int>_>::~linked_ptr
            (&local_870.super_MatcherBase<int>.impl_);
  mp::SPAdapter::GetScenario<MockScenarioHandler>(&local_370,0,&local_838);
  testing::internal::FunctionMockerBase<void_(int,_double)>::~FunctionMockerBase
            (&this_00->super_FunctionMockerBase<void_(int,_double)>);
  testing::internal::FunctionMockerBase<void_(int,_int,_double)>::~FunctionMockerBase
            ((FunctionMockerBase<void_(int,_int,_double)> *)&local_838);
  mp::SPAdapter::~SPAdapter(&local_370);
  local_720.super_ColProblem.super_Problem.super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ColProblem_00198718;
  local_720.super_ColProblem.super_Problem.super_SuffixManager._vptr_SuffixManager =
       (_func_int **)&PTR__ColProblem_00198738;
  if (local_720.super_ColProblem.coefs_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.super_ColProblem.coefs_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_720.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_720.super_ColProblem.coefs_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_720.super_ColProblem.row_indices_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.super_ColProblem.row_indices_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_720.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_720.super_ColProblem.row_indices_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_720.super_ColProblem.col_starts_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.super_ColProblem.col_starts_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_720.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_720.super_ColProblem.col_starts_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&local_720);
  return;
}

Assistant:

TEST(SPTest, RandomRHS) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, 3);
  mp::SPAdapter sp(p);
  auto col = sp.column(0);
  EXPECT_EQ(col.begin(), col.end());
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, -33));
  sp.GetScenario(0, handler);
}